

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O2

void Llb_ImgSchedule(Vec_Ptr_t *vSupps,Vec_Ptr_t **pvQuant0,Vec_Ptr_t **pvQuant1,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  void *pvVar5;
  Vec_Ptr_t **ppVVar6;
  int iVar7;
  int i;
  int iVar8;
  int Entry;
  uint uVar9;
  int i_00;
  
  pVVar3 = Vec_PtrAlloc(vSupps->nSize);
  *pvQuant0 = pVVar3;
  pVVar3 = Vec_PtrAlloc(vSupps->nSize);
  *pvQuant1 = pVVar3;
  for (iVar8 = 0; iVar8 < vSupps->nSize; iVar8 = iVar8 + 1) {
    Vec_PtrEntry(vSupps,iVar8);
    pVVar3 = *pvQuant0;
    pVVar4 = Vec_IntAlloc(0x10);
    Vec_PtrPush(pVVar3,pVVar4);
    pVVar3 = *pvQuant1;
    pVVar4 = Vec_IntAlloc(0x10);
    Vec_PtrPush(pVVar3,pVVar4);
  }
  Entry = 0;
  pvVar5 = Vec_PtrEntry(vSupps,0);
  iVar8 = *(int *)((long)pvVar5 + 4);
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  i_00 = -1;
  for (; Entry != iVar8; Entry = Entry + 1) {
    iVar7 = 0;
    for (i = 0; i < vSupps->nSize; i = i + 1) {
      pVVar4 = (Vec_Int_t *)Vec_PtrEntry(vSupps,i);
      iVar1 = Vec_IntEntry(pVVar4,Entry);
      if (iVar1 != 0) {
        i_00 = i;
      }
      iVar7 = iVar7 + (uint)(iVar1 != 0);
    }
    if (iVar7 != 0) {
      ppVVar6 = pvQuant0;
      if (iVar7 != 1) {
        ppVVar6 = pvQuant1;
      }
      pVVar4 = (Vec_Int_t *)Vec_PtrEntry(*ppVVar6,i_00);
      Vec_IntPush(pVVar4,Entry);
    }
  }
  if (fVerbose != 0) {
    for (uVar9 = 0; iVar8 = vSupps->nSize, (int)uVar9 < iVar8; uVar9 = uVar9 + 1) {
      iVar8 = 0;
      printf("%2d : Quant0 = ",(ulong)uVar9);
      while( true ) {
        pvVar5 = Vec_PtrEntry(*pvQuant0,uVar9);
        if (*(int *)((long)pvVar5 + 4) <= iVar8) break;
        pVVar4 = (Vec_Int_t *)Vec_PtrEntry(*pvQuant0,uVar9);
        uVar2 = Vec_IntEntry(pVVar4,iVar8);
        printf("%d ",(ulong)uVar2);
        iVar8 = iVar8 + 1;
      }
      putchar(10);
    }
    for (uVar9 = 0; (int)uVar9 < iVar8; uVar9 = uVar9 + 1) {
      iVar8 = 0;
      printf("%2d : Quant1 = ",(ulong)uVar9);
      while( true ) {
        pvVar5 = Vec_PtrEntry(*pvQuant1,uVar9);
        if (*(int *)((long)pvVar5 + 4) <= iVar8) break;
        pVVar4 = (Vec_Int_t *)Vec_PtrEntry(*pvQuant1,uVar9);
        uVar2 = Vec_IntEntry(pVVar4,iVar8);
        printf("%d ",(ulong)uVar2);
        iVar8 = iVar8 + 1;
      }
      putchar(10);
      iVar8 = vSupps->nSize;
    }
  }
  return;
}

Assistant:

void Llb_ImgSchedule( Vec_Ptr_t * vSupps, Vec_Ptr_t ** pvQuant0, Vec_Ptr_t ** pvQuant1, int fVerbose )
{
    Vec_Int_t * vOne;
    int nVarsAll, Counter, iSupp = -1, Entry, i, k;
    // start quantification arrays
    *pvQuant0 = Vec_PtrAlloc( Vec_PtrSize(vSupps) );
    *pvQuant1 = Vec_PtrAlloc( Vec_PtrSize(vSupps) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
    {
        Vec_PtrPush( *pvQuant0, Vec_IntAlloc(16) );
        Vec_PtrPush( *pvQuant1, Vec_IntAlloc(16) );
    }
    // count how many times each var appears
    nVarsAll = Vec_IntSize( (Vec_Int_t *)Vec_PtrEntry(vSupps, 0) );
    for ( i = 0; i < nVarsAll; i++ )
    {
        Counter = 0;
        Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vOne, k )
            if ( Vec_IntEntry(vOne, i) )
            {
                iSupp = k;
                Counter++;
            }
        if ( Counter == 0 )
            continue;
        if ( Counter == 1 )
            Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(*pvQuant0, iSupp), i );
        else // if ( Counter > 1 )
            Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(*pvQuant1, iSupp), i );
    }

    if ( fVerbose )
    for ( i = 0; i < Vec_PtrSize(vSupps); i++ )
    {
        printf( "%2d : Quant0 = ", i );
        Vec_IntForEachEntry( (Vec_Int_t *)Vec_PtrEntry(*pvQuant0, i), Entry, k )
            printf( "%d ", Entry );
        printf( "\n" );
    }

    if ( fVerbose )
    for ( i = 0; i < Vec_PtrSize(vSupps); i++ )
    {
        printf( "%2d : Quant1 = ", i );
        Vec_IntForEachEntry( (Vec_Int_t *)Vec_PtrEntry(*pvQuant1, i), Entry, k )
            printf( "%d ", Entry );
        printf( "\n" );
    }
}